

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O3

void __thiscall NJamSpell::TSpellCorrector::PrepareCache(TSpellCorrector *this)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  TRobinHash *__range1;
  TBloomFilter *pTVar4;
  ulong uVar5;
  pointer pbVar6;
  long lVar7;
  uint unaff_EBX;
  long lVar8;
  pointer pbVar9;
  uint uVar10;
  ulong uVar11;
  uint64_t elements;
  undefined1 auVar12 [8];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 local_90 [8];
  vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
  deletes;
  string local_60;
  TRobinHash *local_40;
  pointer local_38;
  
  local_40 = TLangModel::GetWordToId(&this->LangModel);
  pbVar1 = (local_40->
           super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           ).m_ht.m_buckets.
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (local_40->
                super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                ).m_ht.m_buckets.
                super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pbVar6 != pbVar1 && (pbVar6->m_dist_from_ideal_bucket == -1)); pbVar6 = pbVar6 + 1) {
  }
  if (pbVar6 != pbVar1) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar8 = lVar8 + *(long *)((long)&pbVar6->m_value + 8);
      if (lVar7 == 3000) {
        lVar7 = 0xbb9;
        break;
      }
      lVar7 = lVar7 + 1;
      pbVar2 = pbVar6;
      do {
        pbVar6 = pbVar2 + 1;
        if (pbVar2->m_last_bucket != false) break;
        pbVar3 = pbVar2 + 1;
        pbVar2 = pbVar6;
      } while (pbVar3->m_dist_from_ideal_bucket == -1);
    } while (pbVar6 != pbVar1);
    auVar13._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar13._0_8_ = lVar8;
    auVar13._12_4_ = 0x45300000;
    auVar14._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar14._0_8_ = lVar7;
    auVar14._12_4_ = 0x45300000;
    unaff_EBX = (uint)(((auVar13._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                      ((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)));
  }
  uVar10 = 0;
  if (0 < (int)unaff_EBX) {
    uVar10 = unaff_EBX;
  }
  uVar11 = (ulong)(uVar10 + 1) *
           (local_40->
           super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           ).m_ht.m_nb_elements;
  elements = 1000;
  if (1000 < uVar11) {
    elements = uVar11;
  }
  pTVar4 = (TBloomFilter *)operator_new(8);
  TBloomFilter::TBloomFilter(pTVar4,elements,0.001);
  uVar5 = 1;
  if (1 < (int)unaff_EBX) {
    uVar5 = (ulong)unaff_EBX;
  }
  std::__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>::
  reset((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> *)
        &this->Deletes1,pTVar4);
  pTVar4 = (TBloomFilter *)operator_new(8);
  TBloomFilter::TBloomFilter(pTVar4,uVar11 * uVar5,0.001);
  std::__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>::
  reset((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> *)
        &this->Deletes2,pTVar4);
  local_38 = (local_40->
             super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             ).m_ht.m_buckets.
             super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (local_40->
                super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                ).m_ht.m_buckets.
                super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pbVar6 != local_38 && (pbVar6->m_dist_from_ideal_bucket == -1)); pbVar6 = pbVar6 + 1) {
  }
  if (pbVar6 != local_38) {
    local_40 = (TRobinHash *)&this->Deletes2;
    do {
      GetDeletes2((vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                   *)local_90,(wstring *)&(pbVar6->m_value).__align);
      deletes.
      super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           deletes.
           super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      auVar12 = local_90;
      if (local_90 !=
          (undefined1  [8])
          deletes.
          super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pTVar4 = (this->Deletes1)._M_t.
                   super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                   .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl;
          WideToUTF8(&local_60,
                     (((pointer)auVar12)->
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish + -1);
          TBloomFilter::Insert(pTVar4,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          pbVar9 = (((pointer)auVar12)->
                   super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((long)(((pointer)auVar12)->
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 != 0x20) {
            lVar7 = 0;
            uVar11 = 0;
            do {
              pTVar4 = (((__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
                          *)&local_40->_vptr_TRobinHash)->
                       super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                       )._M_t.
                       super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                       .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl;
              WideToUTF8(&local_60,(wstring *)((long)&(pbVar9->_M_dataplus)._M_p + lVar7));
              TBloomFilter::Insert(pTVar4,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p);
              }
              uVar11 = uVar11 + 1;
              pbVar9 = (((pointer)auVar12)->
                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar7 = lVar7 + 0x20;
            } while (uVar11 < ((long)(((pointer)auVar12)->
                                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5
                              ) - 1U);
          }
          auVar12 = (undefined1  [8])((long)auVar12 + 0x18);
        } while (auVar12 !=
                 (undefined1  [8])
                 deletes.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                 *)local_90);
      pbVar1 = pbVar6;
      do {
        pbVar6 = pbVar1 + 1;
        if (pbVar1->m_last_bucket != false) break;
        pbVar2 = pbVar1 + 1;
        pbVar1 = pbVar6;
      } while (pbVar2->m_dist_from_ideal_bucket == -1);
    } while (pbVar6 != local_38);
  }
  return;
}

Assistant:

void TSpellCorrector::PrepareCache() {
    auto&& wordToId = LangModel.GetWordToId();
    size_t n = 0;
    size_t s = 0;
    for (auto&& it: wordToId) {
        n += 1;
        s += it.first.size();
        if (n > 3000) {
            break;
        }
    }
    size_t avgWordLen = std::max(int(double(s) / n) + 1, 1);
    size_t avgWordLenMinusOne = std::max(size_t(1), avgWordLen - 1);

    uint64_t deletes1size = wordToId.size() * avgWordLen;
    uint64_t deletes2size = wordToId.size() * avgWordLen * avgWordLenMinusOne;
    deletes1size = std::max(uint64_t(1000), deletes1size);
    deletes1size = std::max(uint64_t(1000), deletes1size);

    double falsePositiveProb = 0.001;
    Deletes1.reset(new TBloomFilter(deletes1size, falsePositiveProb));
    Deletes2.reset(new TBloomFilter(deletes2size, falsePositiveProb));

    uint64_t deletes1real = 0;
    uint64_t deletes2real = 0;

    for (auto&& it: wordToId) {
        auto deletes = GetDeletes2(it.first);
        for (auto&& w1: deletes) {
            Deletes1->Insert(WideToUTF8(w1.back()));
            deletes1real += 1;
            for (size_t i = 0; i < w1.size() - 1; ++i) {
                Deletes2->Insert(WideToUTF8(w1[i]));
                deletes2real += 1;
            }
        }
    }
}